

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
webfront::http::std::experimental::net::v1::detail::
reactive_socket_service<std::experimental::net::v1::ip::tcp>::assign
          (reactive_socket_service<std::experimental::net::v1::ip::tcp> *this,
          implementation_type *impl,protocol_type *protocol,native_handle_type *native_socket,
          error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  native_handle_type *in_RSI;
  undefined8 in_RDI;
  int type;
  ulong *in_R8;
  error_code eVar2;
  error_code local_50;
  ulong *local_40;
  base_implementation_type *in_stack_ffffffffffffffe8;
  reactive_socket_service_base *in_stack_fffffffffffffff0;
  
  type = (int)((ulong)in_RDI >> 0x20);
  local_40 = in_R8;
  ip::tcp::type((tcp *)in_RDX);
  eVar2 = reactive_socket_service_base::do_assign
                    (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,type,in_RSI,in_RDX);
  local_50._M_cat = eVar2._M_cat;
  local_50._M_value = eVar2._M_value;
  bVar1 = ::std::error_code::operator_cast_to_bool(&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_RSI[4] = in_RDX->_M_value;
  }
  eVar2._0_8_ = *local_40 & 0xffffffff;
  eVar2._M_cat = (error_category *)local_40[1];
  return eVar2;
}

Assistant:

std::error_code assign(implementation_type& impl,
      const protocol_type& protocol, const native_handle_type& native_socket,
      std::error_code& ec)
  {
    if (!do_assign(impl, protocol.type(), native_socket, ec))
      impl.protocol_ = protocol;
    return ec;
  }